

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int lyp_rfn_apply_ext(lys_module *module)

{
  lys_node *plVar1;
  int iVar2;
  ly_set *set;
  lys_ext_instance **pplVar3;
  lys_node *plVar4;
  lys_node *plVar5;
  uint uVar6;
  ulong uVar7;
  lys_node *plVar8;
  uint8_t ext_size;
  lys_node *node;
  lys_refine *rfn;
  uint8_t start;
  ulong uVar9;
  lys_node *node_00;
  lys_node *local_38;
  lys_node *target;
  
  uVar6 = 0;
  node_00 = module->data;
  do {
    if (node_00 == (lys_node *)0x0) {
      return 0;
    }
    plVar1 = node_00->next;
    node = node_00;
    do {
      if ((node->nodetype == LYS_USES) && (node->padding[2] != '\0')) {
        uVar7 = 0;
        do {
          if (node[1].name[uVar7 * 0x50 + 0x1a] != '\0') {
            rfn = (lys_refine *)(node[1].name + uVar7 * 0x50);
            local_38 = (lys_node *)0x0;
            resolve_descendant_schema_nodeid(rfn->target_name,node->child,0xc0ff,0,&local_38);
            if (local_38 == (lys_node *)0x0) {
              ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                     ,0xc45);
              return 1;
            }
            set = ly_set_new();
            pplVar3 = rfn->ext;
            ext_size = rfn->ext_size;
            start = '\0';
            while (iVar2 = lys_ext_iter(pplVar3,ext_size,start,LYEXT_SUBSTMT_SELF), iVar2 != -1) {
              ly_set_add(set,rfn->ext[iVar2]->def,0);
              pplVar3 = rfn->ext;
              ext_size = rfn->ext_size;
              start = (char)iVar2 + '\x01';
            }
            if (set->number != 0) {
              uVar9 = 0;
              do {
                iVar2 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_SELF,
                                           (lys_ext *)(set->set).s[uVar9]);
                if (iVar2 != 0) {
                  ly_set_free(set);
                  return 1;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < set->number);
            }
            ly_set_free(set);
            if ((rfn->dsc != (char *)0x0) &&
               (iVar2 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_DESCRIPTION,(lys_ext *)0x0),
               iVar2 != 0)) {
              return 1;
            }
            if ((rfn->ref != (char *)0x0) &&
               (iVar2 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_REFERENCE,(lys_ext *)0x0),
               iVar2 != 0)) {
              return 1;
            }
            if ((((rfn->flags & 3) != 0) && ((local_38->flags & 3) != 0)) &&
               (iVar2 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_CONFIG,(lys_ext *)0x0),
               iVar2 != 0)) {
              return 1;
            }
            if ((rfn->dflt_size != '\0') &&
               (iVar2 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_DEFAULT,(lys_ext *)0x0),
               iVar2 != 0)) {
              return 1;
            }
            if (((rfn->flags & 0xc0) != 0) &&
               (iVar2 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_MANDATORY,(lys_ext *)0x0),
               iVar2 != 0)) {
              return 1;
            }
            if ((((local_38->nodetype & LYS_CONTAINER) != LYS_UNKNOWN) &&
                ((rfn->mod).presence != (char *)0x0)) &&
               (iVar2 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_PRESENCE,(lys_ext *)0x0),
               iVar2 != 0)) {
              return 1;
            }
            if (((rfn->flags & 0x10) != 0) &&
               (iVar2 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_MIN,(lys_ext *)0x0),
               iVar2 != 0)) {
              return 1;
            }
            if (((rfn->flags & 8) != 0) &&
               (iVar2 = lyp_rfn_apply_ext_(rfn,local_38,LYEXT_SUBSTMT_MAX,(lys_ext *)0x0),
               iVar2 != 0)) {
              return 1;
            }
            if (local_38->ext_size != 0) {
              pplVar3 = (lys_ext_instance **)realloc(local_38->ext,(ulong)local_38->ext_size << 3);
              local_38->ext = pplVar3;
            }
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < node->padding[2]);
      }
      if ((node->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar8 = node->child;
      }
      else {
        plVar8 = (lys_node *)0x0;
      }
      if (plVar8 != (lys_node *)0x0) goto LAB_00129314;
      if (node == node_00) break;
      do {
        plVar8 = node->next;
LAB_00129314:
        if (plVar8 != (lys_node *)0x0) break;
        node = node->parent;
        if (node->nodetype == LYS_AUGMENT) {
          node = node->prev;
        }
        plVar4 = lys_parent(node);
        plVar5 = lys_parent(node_00);
      } while (plVar4 != plVar5);
      node = plVar8;
    } while (plVar8 != (lys_node *)0x0);
    node_00 = plVar1;
    if ((plVar1 == (lys_node *)0x0) && (node_00 = (lys_node *)0x0, uVar6 < module->augment_size)) {
      node_00 = module->augment[uVar6].child;
      uVar6 = uVar6 + 1;
    }
  } while( true );
}

Assistant:

int
lyp_rfn_apply_ext(struct lys_module *module)
{
    int i, k, a = 0;
    struct lys_node *root, *nextroot, *next, *node;
    struct lys_node *target;
    struct lys_node_uses *uses;
    struct lys_refine *rfn;
    struct ly_set *extset;

    /* refines in uses */
    LY_TREE_FOR_SAFE(module->data, nextroot, root) {
        /* go through the data tree of the module and all the defined augments */

        LY_TREE_DFS_BEGIN(root, next, node) {
            if (node->nodetype == LYS_USES) {
                uses = (struct lys_node_uses *)node;

                for (i = 0; i < uses->refine_size; i++) {
                    if (!uses->refine[i].ext_size) {
                        /* no extensions in refine */
                        continue;
                    }
                    rfn = &uses->refine[i]; /* shortcut */

                    /* get the target node */
                    target = NULL;
                    resolve_descendant_schema_nodeid(rfn->target_name, uses->child,
                                                     LYS_NO_RPC_NOTIF_NODE | LYS_ACTION | LYS_NOTIF,
                                                     0, (const struct lys_node **)&target);
                    if (!target) {
                        /* it should always succeed since the target_name was already resolved at least
                         * once when the refine itself was being resolved */
                        LOGINT(module->ctx);;
                        return EXIT_FAILURE;
                    }

                    /* extensions */
                    extset = ly_set_new();
                    k = -1;
                    while ((k = lys_ext_iter(rfn->ext, rfn->ext_size, k + 1, LYEXT_SUBSTMT_SELF)) != -1) {
                        ly_set_add(extset, rfn->ext[k]->def, 0);
                    }
                    for (k = 0; (unsigned int)k < extset->number; k++) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_SELF, (struct lys_ext *)extset->set.g[k])) {
                            ly_set_free(extset);
                            return EXIT_FAILURE;
                        }
                    }
                    ly_set_free(extset);

                    /* description */
                    if (rfn->dsc && lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_DESCRIPTION, NULL)) {
                        return EXIT_FAILURE;
                    }
                    /* reference */
                    if (rfn->ref && lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_REFERENCE, NULL)) {
                        return EXIT_FAILURE;
                    }
                    /* config, in case of notification or rpc/action{notif, the config is not applicable
                     * (there is no config status) */
                    if ((rfn->flags & LYS_CONFIG_MASK) && (target->flags & LYS_CONFIG_MASK)) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_CONFIG, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* default value */
                    if (rfn->dflt_size && lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_DEFAULT, NULL)) {
                        return EXIT_FAILURE;
                    }
                    /* mandatory */
                    if (rfn->flags & LYS_MAND_MASK) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_MANDATORY, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* presence */
                    if ((target->nodetype & LYS_CONTAINER) && rfn->mod.presence) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_PRESENCE, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* min/max */
                    if (rfn->flags & LYS_RFN_MINSET) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_MIN, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    if (rfn->flags & LYS_RFN_MAXSET) {
                        if (lyp_rfn_apply_ext_(rfn, target, LYEXT_SUBSTMT_MAX, NULL)) {
                            return EXIT_FAILURE;
                        }
                    }
                    /* must and if-feature contain extensions on their own, not needed to be solved here */

                    if (target->ext_size) {
                        /* the allocated target's extension array can be now longer than needed in case
                         * there is less refine substatement's extensions than in original. Since we are
                         * going to reduce or keep the same memory, it is not necessary to test realloc's result */
                        target->ext = realloc(target->ext, target->ext_size * sizeof *target->ext);
                    }
                }
            }
            LY_TREE_DFS_END(root, next, node)
        }

        if (!nextroot && a < module->augment_size) {
            nextroot = module->augment[a].child;
            a++;
        }
    }

    return EXIT_SUCCESS;
}